

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O3

void SubTest(void)

{
  ostream *poVar1;
  bool a;
  bool b;
  char local_21;
  
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void SubTest() {
    bool a = 3;
    bool b = 4;
    auto x = &a - &b;
    cout << x << endl;

    cout << &a << endl;
    cout << (&a + 1) << endl;

    auto a1 = &a;
    auto a2 = (&a + 1);
    cout << a1 << ' ' << a2 << endl;
}